

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O2

XmlOutput * __thiscall XmlOutput::operator<<(XmlOutput *this,xml_output *o)

{
  char *ch;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(o->xo_type) {
  case tRaw:
    addRaw(this,&o->xo_text);
    break;
  case tDeclaration:
    addDeclaration(this,&o->xo_text,&o->xo_value);
    break;
  case tTag:
    newTagOpen(this,&o->xo_text);
    break;
  case tTagValue:
    QString::QString((QString *)&local_88,"\n%1<%2>");
    QString::arg<QString,_true>
              ((QString *)&local_70,(QString *)&local_88,&this->currentIndent,0,(QChar)0x20);
    QString::arg<QString,_true>((QString *)&local_58,(QString *)&local_70,&o->xo_text,0,(QChar)0x20)
    ;
    addRaw(this,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    doConversion((QString *)&local_58,this,&o->xo_value);
    addRaw(this,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    this_01 = &local_70;
    QString::QString((QString *)this_01,"</%1>");
    QString::arg<QString,_true>((QString *)&local_58,(QString *)this_01,&o->xo_text,0,(QChar)0x20);
    addRaw(this,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    goto LAB_001e2858;
  case tValueTag:
    doConversion((QString *)&local_58,this,&o->xo_text);
    addRaw(this,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    this->format = NoNewLine;
    closeTag(this);
    this->format = NewLine;
    break;
  case tCloseTag:
    if ((o->xo_value).d.size == 0) {
      if ((o->xo_text).d.size == 0) {
        closeTag(this);
      }
      else {
        closeTo(this,&o->xo_text);
      }
    }
    else {
      closeAll(this);
    }
    break;
  case tAttribute:
    addAttribute(this,&o->xo_text,&o->xo_value);
    break;
  case tAttributeTag:
    addAttributeTag(this,&o->xo_text,&o->xo_value);
    break;
  case tData:
    if ((o->xo_text).d.size == 0) {
      closeOpen(this);
      break;
    }
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    doConversion((QString *)&local_58,this,&o->xo_text);
    local_88.d = (Data *)0x21d038;
    local_88.ptr = (char16_t *)&this->currentIndent;
    QStringBuilder<const_char_(&)[2],_QString_&>::convertTo<QString>
              ((QString *)&local_70,(QStringBuilder<const_char_(&)[2],_QString_&> *)&local_88);
    QString::replace((QChar)(char16_t)&local_58,(QString *)0xa,(CaseSensitivity)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    this_00 = &local_a0;
    QString::QString((QString *)this_00,"\n%1%2");
    QString::arg<QString,_true>
              ((QString *)&local_88,(QString *)this_00,&this->currentIndent,0,(QChar)0x20);
    QString::arg<QString,_true>
              ((QString *)&local_70,(QString *)&local_88,(QString *)&local_58,0,(QChar)0x20);
    addRaw(this,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    goto LAB_001e2850;
  case tImport:
    QString::QString((QString *)&local_a0,"\n%1<Import %2=\"%3\" />");
    QString::arg<QString,_true>
              ((QString *)&local_88,(QString *)&local_a0,&this->currentIndent,0,(QChar)0x20);
    QString::arg<QString,_true>((QString *)&local_70,(QString *)&local_88,&o->xo_text,0,(QChar)0x20)
    ;
    QString::arg<QString,_true>
              ((QString *)&local_58,(QString *)&local_70,&o->xo_value,0,(QChar)0x20);
    addRaw(this,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    this_01 = &local_a0;
    goto LAB_001e2858;
  case tComment:
    ch = "<!--%1-->";
    goto LAB_001e273b;
  case tCDATA:
    ch = "<![CDATA[\n%1\n]]>";
LAB_001e273b:
    local_58.size = -0x5555555555555556;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_58,ch);
    this_00 = &local_70;
    QString::arg<QString,_true>((QString *)this_00,(QString *)&local_58,&o->xo_text,0,(QChar)0x20);
    addRaw(this,(QString *)this_00);
LAB_001e2850:
    this_01 = &local_58;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
LAB_001e2858:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

XmlOutput& XmlOutput::operator<<(const xml_output& o)
{
    switch(o.xo_type) {
    case tNothing:
        break;
    case tRaw:
        addRaw(o.xo_text);
        break;
    case tDeclaration:
        addDeclaration(o.xo_text, o.xo_value);
        break;
    case tTag:
        newTagOpen(o.xo_text);
        break;
    case tTagValue:
        addRaw(QString("\n%1<%2>").arg(currentIndent).arg(o.xo_text));
        addRaw(doConversion(o.xo_value));
        addRaw(QString("</%1>").arg(o.xo_text));
        break;
    case tValueTag:
        addRaw(doConversion(o.xo_text));
        setFormat(NoNewLine);
        closeTag();
        setFormat(NewLine);
        break;
    case tImport:
        addRaw(QString("\n%1<Import %2=\"%3\" />").arg(currentIndent).arg(o.xo_text).arg(o.xo_value));
        break;
    case tCloseTag:
        if (o.xo_value.size())
            closeAll();
        else if (o.xo_text.size())
            closeTo(o.xo_text);
        else
            closeTag();
        break;
    case tAttribute:
        addAttribute(o.xo_text, o.xo_value);
        break;
    case tAttributeTag:
        addAttributeTag(o.xo_text, o.xo_value);
        break;
    case tData:
        {
            // Special case to be able to close tag in normal
            // way ("</tag>", not "/>") without using addRaw()..
            if (!o.xo_text.size()) {
                closeOpen();
                break;
            }
            QString output = doConversion(o.xo_text);
            output.replace('\n', "\n" + currentIndent);
            addRaw(QString("\n%1%2").arg(currentIndent).arg(output));
        }
        break;
    case tComment:
        {
            QString output("<!--%1-->");
            addRaw(output.arg(o.xo_text));
        }
        break;
    case tCDATA:
        {
            QString output("<![CDATA[\n%1\n]]>");
            addRaw(output.arg(o.xo_text));
        }
        break;
    }
    return *this;
}